

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

LY_ERR lyd_path_list_predicate
                 (lyd_node *node,char **buffer,size_t *buflen,size_t *bufused,ly_bool is_static)

{
  LY_ERR LVar1;
  int iVar2;
  lyd_node *node_00;
  char *__s;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  
  node_00 = lyd_child(node);
  while (((node_00 != (lyd_node *)0x0 && (node_00->schema != (lysc_node *)0x0)) &&
         ((node_00->schema->flags & 0x100) != 0))) {
    __s = lyd_get_value(node_00);
    sVar3 = strlen(node_00->schema->name);
    sVar4 = strlen(__s);
    LVar1 = lyd_path_str_enlarge(buffer,buflen,*bufused + sVar4 + sVar3 + 5,is_static);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    pcVar5 = strchr(__s,0x27);
    uVar6 = (uint)(pcVar5 == (char *)0x0) * 5 + 0x22;
    iVar2 = sprintf(*buffer + *bufused,"[%s=%c%s%c]",node_00->schema->name,(ulong)uVar6,__s,
                    (ulong)uVar6);
    *bufused = *bufused + (long)iVar2;
    node_00 = node_00->next;
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_path_list_predicate(const struct lyd_node *node, char **buffer, size_t *buflen, size_t *bufused, ly_bool is_static)
{
    const struct lyd_node *key;
    size_t len;
    const char *val;
    char quot;

    for (key = lyd_child(node); key && key->schema && (key->schema->flags & LYS_KEY); key = key->next) {
        val = lyd_get_value(key);
        len = 1 + strlen(key->schema->name) + 2 + strlen(val) + 2;
        LY_CHECK_RET(lyd_path_str_enlarge(buffer, buflen, *bufused + len, is_static));

        quot = '\'';
        if (strchr(val, '\'')) {
            quot = '"';
        }
        *bufused += sprintf(*buffer + *bufused, "[%s=%c%s%c]", key->schema->name, quot, val, quot);
    }

    return LY_SUCCESS;
}